

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O1

ObjectData * __thiscall
deqp::gles3::Performance::anon_unknown_0::PartialOccluderCullCase::genOccluderGeometry
          (ObjectData *__return_storage_ptr__,PartialOccluderCullCase *this)

{
  long lVar1;
  float data [24];
  allocator_type local_161;
  Geometry local_160;
  ProgramSources local_148;
  float local_78 [5];
  undefined8 local_64;
  undefined8 uStack_5c;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined8 local_44;
  undefined8 uStack_3c;
  undefined8 local_34;
  undefined4 local_2c;
  float local_28;
  undefined8 local_24;
  undefined4 local_1c;
  float local_18 [2];
  
  Utils::getBaseShader();
  local_78[0] = this->m_coverage + this->m_coverage + -1.0;
  local_78[1] = 1.0;
  local_78[2] = 0.2;
  local_78[3] = 0.0;
  local_64 = 0x3e4ccccdbf800000;
  uStack_5c = 0xbf8000003f800000;
  local_54 = 0x3e4ccccdbf800000;
  uStack_4c = 0xbf80000040000000;
  local_44 = 0x3e4ccccdbf800000;
  uStack_3c = 0xbf80000000000000;
  local_34 = 0x3e4ccccd3f800000;
  local_2c = 0x3f800000;
  local_24 = 0x3e4ccccd3f800000;
  local_1c = 0x40000000;
  local_78[4] = local_78[0];
  local_28 = local_78[0];
  std::vector<float,std::allocator<float>>::vector<float_const*,void>
            ((vector<float,std::allocator<float>> *)&local_160,local_78,local_18,&local_161);
  ObjectData::ObjectData(__return_storage_ptr__,&local_148,&local_160);
  if (local_160.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_160.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_160.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_160.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_148.attribLocationBindings);
  lVar1 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_148.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

virtual ObjectData	genOccluderGeometry			(void) const { return ObjectData(Utils::getBaseShader(), Utils::getPartScreenQuad(m_coverage, 0.2f)); }